

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int saxTest(char *filename,size_t limit,int options,int fail)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  int res;
  int fail_local;
  int options_local;
  size_t limit_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  lVar1 = xmlNewSAXParserCtxt(callbackSAX2Handler,0);
  if (lVar1 == 0) {
    fprintf(_stderr,"Failed to create parser context\n");
    filename_local._4_4_ = 1;
  }
  else {
    lVar2 = xmlCtxtReadFile(lVar1,filename,0,options);
    if (lVar2 == 0) {
      if (*(int *)(lVar1 + 0x18) == 0) {
        bVar3 = fail == 0;
        if (bVar3) {
          fprintf(_stderr,"Failed to parse \'%s\' %lu\n",filename,limit);
        }
      }
      else {
        bVar3 = fail != 0;
        if (bVar3) {
          fprintf(_stderr,"Failed to get failure for \'%s\' %lu\n",filename,limit);
        }
      }
      ctxt._4_4_ = (uint)bVar3;
    }
    else {
      fprintf(_stderr,"SAX parsing generated a document !\n");
      xmlFreeDoc(lVar2);
      ctxt._4_4_ = 0;
    }
    xmlFreeParserCtxt(lVar1);
    filename_local._4_4_ = ctxt._4_4_;
  }
  return filename_local._4_4_;
}

Assistant:

static int
saxTest(const char *filename, size_t limit, int options, int fail) {
    int res = 0;
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;

    nb_tests++;

    maxlen = limit;
    ctxt = xmlNewSAXParserCtxt(callbackSAX2Handler, NULL);
    if (ctxt == NULL) {
        fprintf(stderr, "Failed to create parser context\n");
	return(1);
    }
    doc = xmlCtxtReadFile(ctxt, filename, NULL, options);

    if (doc != NULL) {
        fprintf(stderr, "SAX parsing generated a document !\n");
        xmlFreeDoc(doc);
        res = 0;
    } else if (ctxt->wellFormed == 0) {
        if (fail)
            res = 0;
        else {
            fprintf(stderr, "Failed to parse '%s' %lu\n", filename,
                    (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                    filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    xmlFreeParserCtxt(ctxt);

    return(res);
}